

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O0

int TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::ComputeNConnectShapeF(int icon,int order)

{
  int in_ESI;
  int in_EDI;
  int nShapeF;
  int nEdges;
  int nFaces;
  int side;
  int nNodes;
  int local_1c;
  int local_18;
  int local_14;
  undefined4 local_10;
  int local_4;
  
  local_10 = 3;
  local_14 = in_EDI + 3;
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    local_18 = pztopology::TPZTriangle::NumSides(0x18d242a);
    local_1c = pztopology::TPZTriangle::NumSides(0x18d2438);
    local_4 = ComputeNConnectShapeF::anon_class_32_4_863fb898::operator()
                        ((anon_class_32_4_863fb898 *)&stack0xffffffffffffffe4);
  }
  return local_4;
}

Assistant:

int TPZShapeHCurlNoGrads<TSHAPE>::ComputeNConnectShapeF(const int icon, const int order)

{
    constexpr int nNodes = TSHAPE::NCornerNodes;
    const int side = icon + nNodes;
#ifdef PZDEBUG
    if (side < nNodes || side >= TSHAPE::NSides) {
        DebugStop();
    }
#endif
    //given the choice of implementation, there are no shape functions for k=0
    if(order == 0) return 0;
    const auto nFaces = TSHAPE::Dimension < 2 ? 0 : TSHAPE::NumSides(2);
    const auto nEdges = TSHAPE::NumSides(1);
    const int nShapeF = [&](){
        if (side < nNodes + nEdges) {//edge connect
          return 1;
        }
        else if(side < nNodes + nEdges + nFaces){//face connect
            switch(TSHAPE::Type(side)){
            case ETriangle://triangular face
              return (order - 1) * (order+2)/2;
            case EQuadrilateral://quadrilateral face
              // 2k(k+1)- k^2
              return order*(order+2);
            default:
              PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
              DebugStop();
              return 0;
            }
        }
        else{//internal connect (3D element only)
            if constexpr (TSHAPE::Type() == ETetraedro){
                return (order-1)*(order-2)*(2*order+3)/6;
            } else if constexpr (TSHAPE::Type() == ECube){
                return order*order*(2*order+3);
            }
            else if constexpr (TSHAPE::Type() == ECube){
              return order*order*(2*order+3);
            }
            else{
                PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
                DebugStop();
                return 0;
            }
        }
    }();
    return nShapeF;
 }